

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O0

string * __thiscall libtorrent::http_parser::header_abi_cxx11_(http_parser *this,string_view key)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  _Self local_70 [3];
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  _Self local_30;
  const_iterator i;
  http_parser *this_local;
  string_view key_local;
  
  key_local.ptr_ = (char *)key.len_;
  this_local = (http_parser *)key.ptr_;
  i._M_node = (_Base_ptr)this;
  if (header[abi:cxx11](boost::basic_string_view<char,std::char_traits<char>>)::empty_abi_cxx11_ ==
      '\0') {
    iVar2 = __cxa_guard_acquire(&header[abi:cxx11](boost::basic_string_view<char,std::char_traits<char>>)
                                 ::empty_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::string::string
                ((string *)
                 &header[abi:cxx11](boost::basic_string_view<char,std::char_traits<char>>)::
                  empty_abi_cxx11_);
      __cxa_atexit(std::__cxx11::string::~string,
                   &header[abi:cxx11](boost::basic_string_view<char,std::char_traits<char>>)::
                    empty_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&header[abi:cxx11](boost::basic_string_view<char,std::char_traits<char>>)
                           ::empty_abi_cxx11_);
    }
  }
  std::allocator<char>::allocator();
  boost::basic_string_view<char,std::char_traits<char>>::to_string<std::allocator<char>>
            (&local_50,(basic_string_view<char,std::char_traits<char>> *)&this_local,&local_51);
  local_30._M_node =
       (_Base_ptr)
       std::
       multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->m_header,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  local_70[0]._M_node =
       (_Base_ptr)
       std::
       multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->m_header);
  bVar1 = std::operator==(&local_30,local_70);
  if (bVar1) {
    key_local.len_ =
         (size_t)&header[abi:cxx11](boost::basic_string_view<char,std::char_traits<char>>)::
                  empty_abi_cxx11_;
  }
  else {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_30);
    key_local.len_ = (size_t)&ppVar3->second;
  }
  return (string *)key_local.len_;
}

Assistant:

std::string const& http_parser::header(string_view const key) const
	{
		static std::string const empty;
		// TODO: remove to_string() if we're in C++14
		auto const i = m_header.find(key.to_string());
		if (i == m_header.end()) return empty;
		return i->second;
	}